

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O0

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeLinear>::~TPZCompElHCurl
          (TPZCompElHCurl<pzshape::TPZShapeLinear> *this,void **vtt)

{
  TPZCompEl *pTVar1;
  TPZGeoEl *this_00;
  TPZChunkVector<TPZConnect,_10> *pTVar2;
  long *nelem;
  long *in_RSI;
  TPZCompEl *in_RDI;
  int ic;
  int64_t nconnects;
  TPZStack<long,_10> connectlist;
  TPZCompEl *cel;
  TPZGeoEl *gel;
  TPZConnect *in_stack_ffffffffffffff00;
  TPZCompEl *in_stack_ffffffffffffff08;
  TPZAdmChunkVector<TPZConnect,_10> *in_stack_ffffffffffffff10;
  TPZChunkVector<TPZConnect,_10> *this_01;
  int local_a4;
  TPZVec<long> local_98 [3];
  TPZCompEl *local_28;
  undefined4 local_1c;
  TPZGeoEl *local_18;
  
  *(long *)in_RDI = *in_RSI;
  *(long *)((long)&in_RDI->field_0x0 + *(long *)(*(long *)in_RDI + -0x60)) = in_RSI[9];
  local_18 = TPZCompEl::Reference(in_stack_ffffffffffffff08);
  if (local_18 != (TPZGeoEl *)0x0) {
    pTVar1 = TPZGeoEl::Reference(local_18);
    if (pTVar1 != in_RDI) {
      local_1c = 1;
      goto LAB_01bcd5ce;
    }
  }
  if (local_18 != (TPZGeoEl *)0x0) {
    local_28 = TPZGeoEl::Reference(local_18);
    if (local_28 == in_RDI) {
      (**(code **)(*(long *)in_RDI + 0x358))(in_RDI,1);
    }
    this_00 = TPZCompEl::Reference(in_stack_ffffffffffffff08);
    TPZGeoEl::ResetReference(this_00);
  }
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)in_stack_ffffffffffffff10);
  (**(code **)(*(long *)in_RDI + 0x1e0))(in_RDI,local_98);
  pTVar2 = (TPZChunkVector<TPZConnect,_10> *)TPZVec<long>::size(local_98);
  this_01 = pTVar2;
  for (local_a4 = 0; (long)local_a4 < (long)pTVar2; local_a4 = local_a4 + 1) {
    nelem = TPZVec<long>::operator[](local_98,(long)local_a4);
    if (*nelem != -1) {
      in_stack_ffffffffffffff10 = TPZCompMesh::ConnectVec(in_RDI->fMesh);
      in_stack_ffffffffffffff08 = (TPZCompEl *)TPZVec<long>::operator[](local_98,(long)local_a4);
      in_stack_ffffffffffffff00 = TPZChunkVector<TPZConnect,_10>::operator[](this_01,(int64_t)nelem)
      ;
      TPZConnect::DecrementElConnected(in_stack_ffffffffffffff00);
    }
  }
  if (local_18 != (TPZGeoEl *)0x0) {
    TPZGeoEl::ResetReference(local_18);
  }
  TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x1bcd5c3);
  local_1c = 0;
LAB_01bcd5ce:
  TPZManVector<long,_1>::~TPZManVector((TPZManVector<long,_1> *)in_stack_ffffffffffffff00);
  TPZIntelGen<pzshape::TPZShapeLinear>::~TPZIntelGen
            ((TPZIntelGen<pzshape::TPZShapeLinear> *)in_stack_ffffffffffffff10,
             (void **)in_stack_ffffffffffffff08);
  return;
}

Assistant:

TPZCompElHCurl<TSHAPE>::~TPZCompElHCurl(){
    TPZGeoEl *gel = this->Reference();
    if (gel && gel->Reference() != this) {
        return;
    }
    if (gel) {
        TPZCompEl *cel = gel->Reference();
        if (cel == this) {
            this->RemoveSideRestraintsII(TPZInterpolatedElement::MInsertMode::EDelete);
        }
        this->Reference()->ResetReference();
    }
    TPZStack<int64_t > connectlist;
    this->BuildConnectList(connectlist);
    int64_t nconnects = connectlist.size();
    for (int ic = 0; ic < nconnects; ic++) {
        if (connectlist[ic] != -1){
            this->fMesh->ConnectVec()[connectlist[ic]].DecrementElConnected();
        }
    }
    if (gel){
        gel->ResetReference();
    }
}